

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Luna.cpp
# Opt level: O2

void ExecuteFile(char **argv,State *state)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,argv[1],&local_39);
  luna::State::DoModule(state,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void ExecuteFile(const char **argv, luna::State &state)
{
    try
    {
        state.DoModule(argv[1]);
    }
    catch (const luna::OpenFileFail &exp)
    {
        printf("%s: can not open file %s\n", argv[0], exp.What().c_str());
    }
    catch (const luna::Exception &exp)
    {
        printf("%s\n", exp.What().c_str());
    }
}